

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TDeletingArray<FVoxelDef_*,_FVoxelDef_*>::~TDeletingArray
          (TDeletingArray<FVoxelDef_*,_FVoxelDef_*> *this)

{
  FVoxelDef *pFVar1;
  uint i;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 < (this->super_TArray<FVoxelDef_*,_FVoxelDef_*>).Count; uVar2 = uVar2 + 1) {
    pFVar1 = (this->super_TArray<FVoxelDef_*,_FVoxelDef_*>).Array[uVar2];
    if (pFVar1 != (FVoxelDef *)0x0) {
      operator_delete(pFVar1,0x28);
    }
  }
  TArray<FVoxelDef_*,_FVoxelDef_*>::~TArray(&this->super_TArray<FVoxelDef_*,_FVoxelDef_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}